

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.h
# Opt level: O1

string * re2c::replaceParam<unsigned_int>
                   (string *__return_storage_ptr__,string *str,string *param,uint *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  ostringstream strValue;
  long *local_1d0;
  long local_1c0 [2];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (param->_M_string_length != 0) {
    local_1b0 = __return_storage_ptr__;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    uVar5 = std::__cxx11::string::find((char *)str,(ulong)(param->_M_dataplus)._M_p,0);
    while (uVar5 != 0xffffffffffffffff) {
      pcVar2 = (char *)param->_M_string_length;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)str,uVar5,pcVar2,(ulong)local_1d0);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      uVar5 = std::__cxx11::string::find((char *)str,(ulong)(param->_M_dataplus)._M_p,0);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    __return_storage_ptr__ = local_1b0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string replaceParam (std::string str, const std::string & param, const _Ty & value)
{
	if (!param.empty ())
	{
		std::ostringstream strValue;
		strValue << value;
		std::string::size_type pos;
		while((pos = str.find(param)) != std::string::npos)
		{
			str.replace(pos, param.length(), strValue.str());
		}
	}
	return str;
}